

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O0

int tnt_schema_add_index(mh_assoc_t *schema,char **data)

{
  mh_int_t x;
  uint64_t uVar1;
  assoc_val **ppaVar2;
  char *__src;
  char *pcVar3;
  char *name_tmp;
  undefined1 auStack_80 [4];
  mh_int_t space_slot;
  assoc_key space_key;
  uint32_t space_number;
  int64_t tuple_len;
  char *tuple;
  assoc_val *index_string;
  assoc_val *index_number;
  tnt_schema_ival *index;
  tnt_schema_sval *space;
  char **data_local;
  mh_assoc_t *schema_local;
  byte local_1d;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  char **ppcStack_18;
  uint8_t c;
  uint local_c;
  
  index = (tnt_schema_ival *)0x0;
  index_number = (assoc_val *)0x0;
  index_string = (assoc_val *)0x0;
  tuple = (char *)0x0;
  tuple_len = (int64_t)*data;
  local_1a = *(byte *)tuple_len;
  space = (tnt_schema_sval *)data;
  data_local = (char **)schema;
  if (mp_type_hint[local_1a] == MP_ARRAY) {
    ppcStack_18 = (char **)&tuple_len;
    local_19 = mp_load_u8(ppcStack_18);
    if ((local_19 & 0x40) == 0) {
      local_c = local_19 & 0xf;
    }
    else {
      local_c = mp_decode_array_slowpath(local_19,ppcStack_18);
    }
    uVar1 = mp_decode_uint((char **)&tuple_len);
    space_key._12_4_ = SUB84(uVar1,0);
    local_1b = *(byte *)tuple_len;
    if (mp_type_hint[local_1b] == MP_UINT) {
      _auStack_80 = &space_key.field_0xc;
      space_key.id._0_4_ = 4;
      x = mh_assoc_find((mh_assoc_t *)data_local,(assoc_key *)auStack_80,(void *)0x0);
      if (x == *(mh_int_t *)(data_local + 2)) {
        return -1;
      }
      ppaVar2 = mh_assoc_node((mh_assoc_t *)data_local,x);
      index = (tnt_schema_ival *)(*ppaVar2)->data;
      index_number = (assoc_val *)tnt_mem_alloc(0x10);
      if (index_number != (assoc_val *)0x0) {
        memset(index_number,0,0x10);
        local_1c = *(byte *)tuple_len;
        if (mp_type_hint[local_1c] == MP_UINT) {
          uVar1 = mp_decode_uint((char **)&tuple_len);
          *(int *)&(index_number->key).field_0xc = (int)uVar1;
          local_1d = *(byte *)tuple_len;
          if (mp_type_hint[local_1d] == MP_STR) {
            __src = mp_decode_str((char **)&tuple_len,&(index_number->key).id_len);
            pcVar3 = (char *)tnt_mem_alloc((ulong)(index_number->key).id_len);
            (index_number->key).id = pcVar3;
            if ((index_number->key).id != (char *)0x0) {
              memcpy((index_number->key).id,__src,(ulong)(index_number->key).id_len);
              tuple = (char *)tnt_mem_alloc(0x18);
              if (tuple != (char *)0x0) {
                *(char **)tuple = (index_number->key).id;
                *(uint32_t *)(tuple + 8) = (index_number->key).id_len;
                *(assoc_val **)(tuple + 0x10) = index_number;
                index_string = (assoc_val *)tnt_mem_alloc(0x18);
                if (index_string != (assoc_val *)0x0) {
                  (index_string->key).id = &(index_number->key).field_0xc;
                  (index_string->key).id_len = 4;
                  index_string->data = index_number;
                  mh_assoc_put((mh_assoc_t *)index[1].name,(assoc_val **)&tuple,(assoc_val ***)0x0,
                               (void *)0x0);
                  mh_assoc_put((mh_assoc_t *)index[1].name,&index_string,(assoc_val ***)0x0,
                               (void *)0x0);
                  mp_next(&space->name);
                  return 0;
                }
                index_string = (assoc_val *)0x0;
              }
            }
          }
        }
      }
    }
  }
  mp_next(&space->name);
  if (tuple != (char *)0x0) {
    tnt_mem_free(tuple);
  }
  if (index_string != (assoc_val *)0x0) {
    tnt_mem_free(index_string);
  }
  tnt_schema_ival_free((tnt_schema_ival *)index_number);
  return -1;
}

Assistant:

static inline int
tnt_schema_add_index(struct mh_assoc_t *schema, const char **data) {
	const struct tnt_schema_sval *space = NULL;
	struct tnt_schema_ival *index = NULL;
	struct assoc_val *index_number = NULL, *index_string = NULL;
	const char *tuple = *data;
	if (mp_typeof(*tuple) != MP_ARRAY)
		goto error;
	int64_t tuple_len = mp_decode_array(&tuple); (void )tuple_len;
	uint32_t space_number = mp_decode_uint(&tuple);
	if (mp_typeof(*tuple) != MP_UINT)
		goto error;
	struct assoc_key space_key = {
		(void *)&(space_number),
		sizeof(uint32_t)
	};
	mh_int_t space_slot = mh_assoc_find(schema, &space_key, NULL);
	if (space_slot == mh_end(schema))
		return -1;
	space = (*mh_assoc_node(schema, space_slot))->data;
	index = tnt_mem_alloc(sizeof(struct tnt_schema_ival));
	if (!index)
		goto error;
	memset(index, 0, sizeof(struct tnt_schema_ival));
	if (mp_typeof(*tuple) != MP_UINT)
		goto error;
	index->number = mp_decode_uint(&tuple);
	if (mp_typeof(*tuple) != MP_STR)
		goto error;
	const char *name_tmp = mp_decode_str(&tuple, &index->name_len);
	index->name = tnt_mem_alloc(index->name_len);
	if (!index->name)
		goto error;
	memcpy((void *)index->name, name_tmp, index->name_len);

	index_string = tnt_mem_alloc(sizeof(struct assoc_val));
	if (!index_string) goto error;
	index_string->key.id     = index->name;
	index_string->key.id_len = index->name_len;
	index_string->data = index;
	index_number = tnt_mem_alloc(sizeof(struct assoc_val));
	if (!index_number) goto error;
	index_number->key.id     = (void *)&(index->number);
	index_number->key.id_len = sizeof(uint32_t);
	index_number->data = index;
	mh_assoc_put(space->index, (const struct assoc_val **)&index_string,
		     NULL, NULL);
	mh_assoc_put(space->index, (const struct assoc_val **)&index_number,
		     NULL, NULL);
	mp_next(data);
	return 0;
error:
	mp_next(data);
	if (index_string) tnt_mem_free(index_string);
	if (index_number) tnt_mem_free(index_number);
	tnt_schema_ival_free(index);
	return -1;
}